

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O3

bool __thiscall URI::parseString(URI *this)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  long *local_50 [2];
  long local_40 [2];
  
  this->mRelative = false;
  this->mModified = false;
  psVar1 = &this->mFullString;
  uVar6 = 0;
  lVar3 = std::__cxx11::string::find((char *)psVar1,0x126013,0);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)&this->mScheme,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uVar6 = lVar3 + 1;
  }
  uVar4 = std::__cxx11::string::find((char *)psVar1,0x126b79,uVar6);
  if (uVar4 == uVar6) {
    uVar6 = uVar6 + 2;
  }
  else {
    uVar4 = std::__cxx11::string::find((char *)psVar1,0x126b7a,uVar6);
    if (uVar4 == uVar6) goto LAB_00121313;
    if ((this->mScheme)._M_string_length == 0) {
      this->mRelative = true;
      goto LAB_00121313;
    }
  }
  uVar6 = std::__cxx11::string::find((char *)psVar1,0x126b7a,uVar6);
  std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&this->mAuthority,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
LAB_00121313:
  bVar5 = true;
  if (uVar6 < (this->mFullString)._M_string_length) {
    lVar3 = std::__cxx11::string::find((char *)psVar1,0x124f86,uVar6);
    std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)&this->mPath,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (lVar3 != -1) {
      lVar3 = std::__cxx11::string::find((char *)psVar1,0x126b7c,lVar3 + 1);
      std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
      std::__cxx11::string::operator=((string *)&this->mQueryString,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      bVar2 = parseQuery(this);
      if (bVar2) {
        if (lVar3 != -1) {
          std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
          std::__cxx11::string::operator=((string *)&this->mFragment,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
      }
      else {
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

bool URI::parseString()
{
	mModified = false;
	mRelative = false;
	
	string::size_type start = 0;
	string::size_type off = mFullString.find( ":" );
	
	if ( off != string::npos )
	{
		mScheme = mFullString.substr( 0, off );
		LOG_NOISE( "scheme is %s", mScheme.c_str() );
		off++;
		start = off;
	}
	
	bool hasAuth = false;

	// if the next chars are // or if they are not a / and we have a scheme
	//  then parse auth, otherwise if no / is found and we don't have a schem 
	//  this is a relative URI. 
	if ( mFullString.find( "//", start ) == start ) 
	{
		hasAuth = true;
		start += 2;
	}
	else if ( mFullString.find( "/", start ) != start )
	{
		if ( mScheme.empty() )
		{
			mRelative = true;
			hasAuth = false;
		}
		else
		{
			hasAuth = true;
		}
	}		
	
	if ( hasAuth )
	{
		off = mFullString.find( "/", start );

		mAuthority = mFullString.substr( start, off - start );
		LOG_NOISE( "auth is %s", mAuthority.c_str() );

		start = off;
	}
		
	if ( start < mFullString.size() )
	{
		off = mFullString.find( "?", start );
		
		mPath = mFullString.substr( start, off - start );
		
		LOG_NOISE( "path is %s", mPath.c_str() );
		
		if ( off != string::npos )
		{
			start = off + 1;
			off = mFullString.find( "#", start );
			
			mQueryString = mFullString.substr( start, off - start );
			LOG_NOISE( "query is %s", mQueryString.c_str() );
			
			if ( parseQuery() == false )
				return false;
			
			if ( off != string::npos )
			{				
				mFragment = mFullString.substr( off + 1 );
				LOG_NOISE( "fragment is %s", mFragment.c_str() );
			}
		}
	}

	return true;
}